

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

cmSourceFile *
anon_unknown.dwarf_15067f::AddCustomCommand
          (cmLocalGenerator *lg,cmCommandOrigin origin,
          unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *cc,bool replace)

{
  cmMakefile *this;
  cmGlobalGenerator *pcVar1;
  cmake *this_00;
  bool bVar2;
  cmListFileBacktrace *bt;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *outputs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *outputs_00;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *__x;
  string *psVar3;
  cmCustomCommand *pcVar4;
  size_type sVar5;
  string *a;
  cmSourceFile *this_01;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *pvVar6;
  string_view input;
  cmSourceFile *local_f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allConfigOutputs;
  _Head_base<0UL,_cmCustomCommand_*,_false> local_b0;
  string simple;
  cmCryptoHash h;
  string local_70;
  string outName;
  
  this = lg->Makefile;
  bt = cmCustomCommand::GetBacktrace
                 ((cc->_M_t).
                  super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t
                  .super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
                  super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl);
  outputs = cmCustomCommand::GetOutputs_abi_cxx11_
                      ((cc->_M_t).
                       super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                       .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl);
  outputs_00 = cmCustomCommand::GetByproducts_abi_cxx11_
                         ((cc->_M_t).
                          super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                          .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl);
  __x = &cmCustomCommand::GetCommandLines
                   ((cc->_M_t).
                    super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                    .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl)->
         super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>;
  if (((__x->super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>)._M_impl.
       super__Vector_impl_data._M_start !=
       (__x->super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>)._M_impl.
       super__Vector_impl_data._M_finish) &&
     (pcVar4 = (cc->_M_t).
               super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
               super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
               super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,
     pcVar4->HasMainDependency_ == true)) {
    psVar3 = cmCustomCommand::GetMainDependency_abi_cxx11_(pcVar4);
    local_f8 = cmMakefile::GetSource(this,psVar3,Ambiguous);
    if (local_f8 == (cmSourceFile *)0x0) {
      this_01 = cmMakefile::CreateSource(this,psVar3,false,Ambiguous);
    }
    else {
      pcVar4 = cmSourceFile::GetCustomCommand(local_f8);
      this_01 = local_f8;
      if (pcVar4 == (cmCustomCommand *)0x0 || replace) goto LAB_001b0edc;
      pcVar4 = cmSourceFile::GetCustomCommand(local_f8);
      pvVar6 = &cmCustomCommand::GetCommandLines(pcVar4)->
                super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>;
      bVar2 = std::operator==(__x,pvVar6);
      if (bVar2) {
        return local_f8;
      }
      this_01 = (cmSourceFile *)0x0;
    }
    if (this_01 != (cmSourceFile *)0x0) goto LAB_001b0edc;
  }
  pcVar1 = lg->GlobalGenerator;
  psVar3 = (outputs->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  sVar5 = cmGeneratorExpression::Find(psVar3);
  std::__cxx11::string::string((string *)&simple,(string *)psVar3);
  if (sVar5 != 0xffffffffffffffff) {
    cmsys::SystemTools::ReplaceString(&simple,"$<CONFIG>","(CONFIG)");
    sVar5 = cmGeneratorExpression::Find(&simple);
    if (sVar5 != 0xffffffffffffffff) {
      std::__cxx11::string::~string((string *)&simple);
      cmLocalGenerator::ExpandCustomCommandOutputGenex(&allConfigOutputs,lg,psVar3,bt);
      if ((long)allConfigOutputs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)allConfigOutputs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x20) {
        std::__cxx11::string::string
                  ((string *)&simple,
                   (string *)
                   allConfigOutputs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&allConfigOutputs);
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&allConfigOutputs);
        cmCryptoHash::cmCryptoHash(&h,AlgoSHA256);
        a = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(lg);
        input._M_str = (psVar3->_M_dataplus)._M_p;
        input._M_len = psVar3->_M_string_length;
        cmCryptoHash::HashString_abi_cxx11_(&local_70,&h,input);
        std::__cxx11::string::substr((ulong)&allConfigOutputs,(ulong)&local_70);
        cmStrCat<std::__cxx11::string_const&,char_const(&)[13],std::__cxx11::string>
                  (&simple,a,(char (*) [13])0x6d142c,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &allConfigOutputs);
        std::__cxx11::string::~string((string *)&allConfigOutputs);
        std::__cxx11::string::~string((string *)&local_70);
        cmCryptoHash::~cmCryptoHash(&h);
      }
    }
  }
  (*pcVar1->_vptr_cmGlobalGenerator[0x36])(&outName,pcVar1,&simple);
  std::__cxx11::string::~string((string *)&simple);
  this_01 = cmMakefile::GetSource(this,&outName,Known);
  if (this_01 == (cmSourceFile *)0x0) {
    this_01 = cmMakefile::CreateSource(this,&outName,true,Known);
LAB_001b0e11:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&allConfigOutputs,"__CMAKE_RULE",(allocator<char> *)&simple);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"1",(allocator<char> *)&h);
    cmSourceFile::SetProperty(this_01,(string *)&allConfigOutputs,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&allConfigOutputs);
    bVar2 = true;
  }
  else {
    pcVar4 = cmSourceFile::GetCustomCommand(this_01);
    if (pcVar4 == (cmCustomCommand *)0x0 || replace) goto LAB_001b0e11;
    pcVar4 = cmSourceFile::GetCustomCommand(this_01);
    pvVar6 = &cmCustomCommand::GetCommandLines(pcVar4)->
              super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>;
    bVar2 = std::operator!=(__x,pvVar6);
    if (bVar2) {
      this_00 = lg->GlobalGenerator->CMakeInstance;
      cmStrCat<char_const(&)[42],std::__cxx11::string&,char_const(&)[34]>
                ((string *)&allConfigOutputs,
                 (char (*) [42])"Attempt to add a custom rule to output\n  ",&outName,
                 (char (*) [34])"\nwhich already has a custom rule.");
      cmake::IssueMessage(this_00,FATAL_ERROR,(string *)&allConfigOutputs,bt);
      std::__cxx11::string::~string((string *)&allConfigOutputs);
    }
    bVar2 = false;
    local_f8 = this_01;
  }
  std::__cxx11::string::~string((string *)&outName);
  if (!bVar2) {
    return local_f8;
  }
LAB_001b0edc:
  cmCustomCommand::SetEscapeAllowMakeVars
            ((cc->_M_t).
             super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
             super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
             super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl,true);
  cmLocalGenerator::AddSourceOutputs(lg,this_01,outputs,Primary,bt,origin);
  cmLocalGenerator::AddSourceOutputs(lg,this_01,outputs_00,Byproduct,bt,origin);
  local_b0._M_head_impl =
       (cc->_M_t).super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t
       .super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
       super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl;
  (cc->_M_t).super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
  super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
  super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl = (cmCustomCommand *)0x0;
  cmSourceFile::SetCustomCommand
            (this_01,(unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_b0
            );
  std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
            ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_b0);
  return this_01;
}

Assistant:

cmSourceFile* AddCustomCommand(cmLocalGenerator& lg, cmCommandOrigin origin,
                               std::unique_ptr<cmCustomCommand> cc,
                               bool replace)
{
  cmMakefile* mf = lg.GetMakefile();
  const auto& lfbt = cc->GetBacktrace();
  const auto& outputs = cc->GetOutputs();
  const auto& byproducts = cc->GetByproducts();
  const auto& commandLines = cc->GetCommandLines();

  // Choose a source file on which to store the custom command.
  cmSourceFile* file = nullptr;
  if (!commandLines.empty() && cc->HasMainDependency()) {
    const auto& main_dependency = cc->GetMainDependency();
    // The main dependency was specified.  Use it unless a different
    // custom command already used it.
    file = mf->GetSource(main_dependency);
    if (file && file->GetCustomCommand() && !replace) {
      // The main dependency already has a custom command.
      if (commandLines == file->GetCustomCommand()->GetCommandLines()) {
        // The existing custom command is identical.  Silently ignore
        // the duplicate.
        return file;
      }
      // The existing custom command is different.  We need to
      // generate a rule file for this new command.
      file = nullptr;
    } else if (!file) {
      file = mf->CreateSource(main_dependency);
    }
  }

  // Generate a rule file if the main dependency is not available.
  if (!file) {
    cmGlobalGenerator* gg = lg.GetGlobalGenerator();

    // Construct a rule file associated with the first output produced.
    std::string outName = gg->GenerateRuleFile(
      ComputeCustomCommandRuleFileName(lg, lfbt, outputs[0]));

    // Check if the rule file already exists.
    file = mf->GetSource(outName, cmSourceFileLocationKind::Known);
    if (file && file->GetCustomCommand() && !replace) {
      // The rule file already exists.
      if (commandLines != file->GetCustomCommand()->GetCommandLines()) {
        lg.GetCMakeInstance()->IssueMessage(
          MessageType::FATAL_ERROR,
          cmStrCat("Attempt to add a custom rule to output\n  ", outName,
                   "\nwhich already has a custom rule."),
          lfbt);
      }
      return file;
    }

    // Create a cmSourceFile for the rule file.
    if (!file) {
      file = mf->CreateSource(outName, true, cmSourceFileLocationKind::Known);
    }
    file->SetProperty("__CMAKE_RULE", "1");
  }

  // Attach the custom command to the file.
  if (file) {
    cc->SetEscapeAllowMakeVars(true);

    lg.AddSourceOutputs(file, outputs, cmLocalGenerator::OutputRole::Primary,
                        lfbt, origin);
    lg.AddSourceOutputs(file, byproducts,
                        cmLocalGenerator::OutputRole::Byproduct, lfbt, origin);

    file->SetCustomCommand(std::move(cc));
  }
  return file;
}